

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopBalance.c
# Opt level: O2

Hop_Obj_t *
Hop_NodeBalanceBuildSuper(Hop_Man_t *p,Vec_Ptr_t *vSuper,Hop_Type_t Type,int fUpdateLevel)

{
  uint uVar1;
  void **ppvVar2;
  Hop_Obj_t *pHVar3;
  int i;
  int iVar4;
  void *pvVar5;
  void *pvVar6;
  Hop_Obj_t *pHVar7;
  Hop_Obj_t *pHVar8;
  Hop_Obj_t *Entry;
  Hop_Obj_t *pHVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  Hop_Obj_t *pObj;
  Hop_Obj_t *pHVar15;
  
  if ((long)vSuper->nSize < 2) {
    __assert_fail("vSuper->nSize > 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/hop/hopBalance.c"
                  ,0xf7,
                  "Hop_Obj_t *Hop_NodeBalanceBuildSuper(Hop_Man_t *, Vec_Ptr_t *, Hop_Type_t, int)")
    ;
  }
  qsort(vSuper->pArray,(long)vSuper->nSize,8,Hop_NodeCompareLevelsDecrease);
  uVar14 = (ulong)(uint)vSuper->nSize;
LAB_00634219:
  do {
    iVar12 = (int)uVar14;
    if (iVar12 < 2) {
      pHVar7 = (Hop_Obj_t *)Vec_PtrEntry(vSuper,0);
      return pHVar7;
    }
    iVar13 = 0;
    if (iVar12 != 2 && fUpdateLevel != 0) {
      pvVar5 = Vec_PtrEntry(vSuper,iVar12 + -2);
      for (iVar13 = iVar12 + -3; -1 < iVar13; iVar13 = iVar13 + -1) {
        pvVar6 = Vec_PtrEntry(vSuper,iVar13);
        if (0x3f < (*(uint *)(((ulong)pvVar5 & 0xfffffffffffffffe) + 0x20) ^
                   *(uint *)(((ulong)pvVar6 & 0xfffffffffffffffe) + 0x20))) goto LAB_0063427c;
      }
      iVar13 = -1;
LAB_0063427c:
      iVar13 = iVar13 + 1;
      pvVar6 = Vec_PtrEntry(vSuper,iVar13);
      if (0x3f < (*(uint *)(((ulong)pvVar5 & 0xfffffffffffffffe) + 0x20) ^
                 *(uint *)(((ulong)pvVar6 & 0xfffffffffffffffe) + 0x20))) {
        __assert_fail("Hop_ObjLevel(Hop_Regular(pObjLeft)) == Hop_ObjLevel(Hop_Regular(pObjRight))",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/hop/hopBalance.c"
                      ,0x12e,"int Hop_NodeBalanceFindLeft(Vec_Ptr_t *)");
      }
      iVar12 = vSuper->nSize;
    }
    i = iVar12 + -2;
    if (i < iVar13) {
      __assert_fail("LeftBound <= RightBound",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/hop/hopBalance.c"
                    ,0x144,"void Hop_NodeBalancePermute(Hop_Man_t *, Vec_Ptr_t *, int, int)");
    }
    if (i != iVar13) {
      pHVar7 = (Hop_Obj_t *)Vec_PtrEntry(vSuper,iVar12 + -1);
      pHVar8 = (Hop_Obj_t *)Vec_PtrEntry(vSuper,i);
      pObj = (Hop_Obj_t *)((ulong)pHVar7 & 0xfffffffffffffffe);
      if ((p->pConst1 != pObj) &&
         (iVar12 = i, p->pConst1 != (Hop_Obj_t *)((ulong)pHVar8 & 0xfffffffffffffffe))) {
        for (; iVar13 <= iVar12; iVar12 = iVar12 + -1) {
          Entry = (Hop_Obj_t *)Vec_PtrEntry(vSuper,iVar12);
          pHVar15 = (Hop_Obj_t *)((ulong)Entry & 0xfffffffffffffffe);
          if (p->pConst1 == pHVar15) {
LAB_006343c1:
            Vec_PtrWriteEntry(vSuper,iVar12,pHVar8);
            Vec_PtrWriteEntry(vSuper,i,Entry);
            break;
          }
          if ((Type != AIG_EXOR) && (iVar4 = Hop_ObjIsConst1(pObj), iVar4 != 0)) {
            __assert_fail("Type != AIG_AND || !Hop_ObjIsConst1(Hop_Regular(p0))",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/hop/hop.h"
                          ,0xd3,
                          "Hop_Obj_t *Hop_ObjCreateGhost(Hop_Man_t *, Hop_Obj_t *, Hop_Obj_t *, Hop_Type_t)"
                         );
          }
          if (Entry == (Hop_Obj_t *)0x0) {
            pHVar15 = (Hop_Obj_t *)0x0;
          }
          else {
            iVar4 = Hop_ObjIsConst1(pHVar15);
            if (iVar4 != 0) {
              __assert_fail("p1 == NULL || !Hop_ObjIsConst1(Hop_Regular(p1))",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/hop/hop.h"
                            ,0xd4,
                            "Hop_Obj_t *Hop_ObjCreateGhost(Hop_Man_t *, Hop_Obj_t *, Hop_Obj_t *, Hop_Type_t)"
                           );
            }
          }
          if (pObj == pHVar15) {
            __assert_fail("Type == AIG_PI || Hop_Regular(p0) != Hop_Regular(p1)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/hop/hop.h"
                          ,0xd5,
                          "Hop_Obj_t *Hop_ObjCreateGhost(Hop_Man_t *, Hop_Obj_t *, Hop_Obj_t *, Hop_Type_t)"
                         );
          }
          *(uint *)&(p->Ghost).field_0x20 =
               (*(uint *)&(p->Ghost).field_0x20 & 0xfffffff8) + (Type == AIG_EXOR | 4);
          pHVar9 = pHVar7;
          pHVar3 = Entry;
          if (pObj->Id < pHVar15->Id) {
            pHVar9 = Entry;
            pHVar3 = pHVar7;
          }
          (p->Ghost).pFanin0 = pHVar3;
          (p->Ghost).pFanin1 = pHVar9;
          pHVar15 = Hop_TableLookup(p,&p->Ghost);
          if (pHVar15 != (Hop_Obj_t *)0x0) {
            if (Entry != pHVar8) goto LAB_006343c1;
            break;
          }
        }
      }
    }
    pHVar7 = (Hop_Obj_t *)Vec_PtrPop(vSuper);
    pHVar8 = (Hop_Obj_t *)Vec_PtrPop(vSuper);
    pHVar7 = Hop_Oper(p,pHVar7,pHVar8,Type);
    uVar1 = vSuper->nSize;
    uVar14 = (ulong)uVar1;
    uVar10 = 0;
    if (0 < (int)uVar1) {
      uVar10 = (ulong)uVar1;
    }
    uVar11 = 0;
    do {
      if (uVar10 == uVar11) {
        Vec_PtrPush(vSuper,pHVar7);
        uVar14 = (ulong)(uint)vSuper->nSize;
        uVar10 = uVar14;
        goto LAB_00634445;
      }
      ppvVar2 = vSuper->pArray + uVar11;
      uVar11 = uVar11 + 1;
    } while ((Hop_Obj_t *)*ppvVar2 != pHVar7);
  } while( true );
LAB_00634445:
  if ((int)uVar10 < 2) goto LAB_00634219;
  ppvVar2 = vSuper->pArray;
  pvVar5 = ppvVar2[uVar10 - 1];
  if (*(uint *)(((ulong)pvVar5 & 0xfffffffffffffffe) + 0x20) >> 6 <=
      *(uint *)(((ulong)ppvVar2[uVar10 - 2] & 0xfffffffffffffffe) + 0x20) >> 6) goto LAB_00634219;
  ppvVar2[uVar10 - 1] = ppvVar2[uVar10 - 2];
  vSuper->pArray[uVar10 - 2] = pvVar5;
  uVar10 = uVar10 - 1;
  goto LAB_00634445;
}

Assistant:

Hop_Obj_t * Hop_NodeBalanceBuildSuper( Hop_Man_t * p, Vec_Ptr_t * vSuper, Hop_Type_t Type, int fUpdateLevel )
{
    Hop_Obj_t * pObj1, * pObj2;
    int LeftBound;
    assert( vSuper->nSize > 1 );
    // sort the new nodes by level in the decreasing order
    Vec_PtrSort( vSuper, (int (*)(void))Hop_NodeCompareLevelsDecrease );
    // balance the nodes
    while ( vSuper->nSize > 1 )
    {
        // find the left bound on the node to be paired
        LeftBound = (!fUpdateLevel)? 0 : Hop_NodeBalanceFindLeft( vSuper );
        // find the node that can be shared (if no such node, randomize choice)
        Hop_NodeBalancePermute( p, vSuper, LeftBound, Type == AIG_EXOR );
        // pull out the last two nodes
        pObj1 = (Hop_Obj_t *)Vec_PtrPop(vSuper);
        pObj2 = (Hop_Obj_t *)Vec_PtrPop(vSuper);
        Hop_NodeBalancePushUniqueOrderByLevel( vSuper, Hop_Oper(p, pObj1, pObj2, Type) );
    }
    return (Hop_Obj_t *)Vec_PtrEntry(vSuper, 0);
}